

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexycal.cpp
# Opt level: O3

void lexical_analyzer_init(FILE *fp)

{
  filePointer = fp;
  ReservedWordsTable::cInsert(&reservedWordsTable,7,"if");
  ReservedWordsTable::cInsert(&reservedWordsTable,9,"else");
  ReservedWordsTable::cInsert(&reservedWordsTable,0x1b,"try");
  ReservedWordsTable::cInsert(&reservedWordsTable,0x1c,"catch");
  ReservedWordsTable::cInsert(&reservedWordsTable,0xb,"int");
  ReservedWordsTable::cInsert(&reservedWordsTable,0xc,"float");
  ReservedWordsTable::cInsert(&reservedWordsTable,8,"bool");
  ReservedWordsTable::cInsert(&reservedWordsTable,0x17,"return");
  ReservedWordsTable::cInsert(&reservedWordsTable,0x12,"while");
  ReservedWordsTable::cInsert(&reservedWordsTable,0x16,"break");
  ReservedWordsTable::cInsert(&reservedWordsTable,0x15,"switch");
  ReservedWordsTable::cInsert(&reservedWordsTable,0x18,"print");
  ReservedWordsTable::cInsert(&reservedWordsTable,0x19,"readln");
  ReservedWordsTable::cInsert(&reservedWordsTable,0x1d,"case");
  ReservedWordsTable::cInsert(&reservedWordsTable,0x1a,"throw");
  ReservedWordsTable::cInsert(&reservedWordsTable,0x1f,"true");
  ReservedWordsTable::cInsert(&reservedWordsTable,0x20,"false");
  ReservedWordsTable::cInsert(&reservedWordsTable,0x27,"char");
  ReservedWordsTable::cInsert(&reservedWordsTable,0x34,"typedef");
  ReservedWordsTable::cInsert(&reservedWordsTable,0x35,"struct");
  get_next_char();
  return;
}

Assistant:

void lexical_analyzer_init(FILE *fp) {

    filePointer = fp;

    reservedWordsTable.cInsert(IF, "if");
    reservedWordsTable.cInsert(ELSE, "else");
    reservedWordsTable.cInsert(TRY, "try");
    reservedWordsTable.cInsert(CATCH, "catch");
    reservedWordsTable.cInsert(INT, "int");
    reservedWordsTable.cInsert(FLOAT, "float");
    reservedWordsTable.cInsert(BOOL, "bool");
    reservedWordsTable.cInsert(RETURN, "return");
    reservedWordsTable.cInsert(WHILE, "while");
    reservedWordsTable.cInsert(BREAK, "break");
    reservedWordsTable.cInsert(SWITCH, "switch");
    reservedWordsTable.cInsert(PRINT, "print");
    reservedWordsTable.cInsert(READLN, "readln");
    reservedWordsTable.cInsert(CASE, "case");
    reservedWordsTable.cInsert(THROW, "throw");
    reservedWordsTable.cInsert(TRUE, "true");
    reservedWordsTable.cInsert(FALSE, "false");
    reservedWordsTable.cInsert(CHAR, "char");
    reservedWordsTable.cInsert(TYPEDEF, "typedef");
    reservedWordsTable.cInsert(STRUCT, "struct");

    get_next_char();
}